

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_ar_close(archive_write *a)

{
  long in_RDI;
  int ret;
  ar_w *ar;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  if (*(char *)(*(long *)(in_RDI + 0xd0) + 0x18) == '\0') {
    *(undefined1 *)(*(long *)(in_RDI + 0xd0) + 0x18) = 1;
    local_4 = __archive_write_output
                        ((archive_write *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8,0x1b1804);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_write_ar_close(struct archive_write *a)
{
	struct ar_w *ar;
	int ret;

	/*
	 * If we haven't written anything yet, we need to write
	 * the ar global header now to make it a valid ar archive.
	 */
	ar = (struct ar_w *)a->format_data;
	if (!ar->wrote_global_header) {
		ar->wrote_global_header = 1;
		ret = __archive_write_output(a, "!<arch>\n", 8);
		return (ret);
	}

	return (ARCHIVE_OK);
}